

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Array.h
# Opt level: O2

void idx2::Resize<idx2::array<idx2::v3<int>>>
               (array<idx2::array<idx2::v3<int>_>_> *Array,i64 NewSize)

{
  long lVar1;
  array<idx2::v3<int>_> *It;
  byte *pbVar2;
  
  if (Array->Capacity < NewSize) {
    GrowCapacity<idx2::array<idx2::v3<int>>>(Array,NewSize);
  }
  lVar1 = Array->Size;
  if (lVar1 < NewSize) {
    pbVar2 = (Array->Buffer).Data + lVar1 * 0x30;
    Mallocator();
    Mallocator();
    for (lVar1 = NewSize * 0x30 + lVar1 * -0x30; lVar1 != 0; lVar1 = lVar1 + -0x30) {
      pbVar2[0] = '\0';
      pbVar2[1] = '\0';
      pbVar2[2] = '\0';
      pbVar2[3] = '\0';
      pbVar2[4] = '\0';
      pbVar2[5] = '\0';
      pbVar2[6] = '\0';
      pbVar2[7] = '\0';
      pbVar2[8] = '\0';
      pbVar2[9] = '\0';
      pbVar2[10] = '\0';
      pbVar2[0xb] = '\0';
      pbVar2[0xc] = '\0';
      pbVar2[0xd] = '\0';
      pbVar2[0xe] = '\0';
      pbVar2[0xf] = '\0';
      *(mallocator **)(pbVar2 + 0x10) = &Mallocator::Instance;
      pbVar2[0x18] = '\0';
      pbVar2[0x19] = '\0';
      pbVar2[0x1a] = '\0';
      pbVar2[0x1b] = '\0';
      pbVar2[0x1c] = '\0';
      pbVar2[0x1d] = '\0';
      pbVar2[0x1e] = '\0';
      pbVar2[0x1f] = '\0';
      pbVar2[0x20] = '\0';
      pbVar2[0x21] = '\0';
      pbVar2[0x22] = '\0';
      pbVar2[0x23] = '\0';
      pbVar2[0x24] = '\0';
      pbVar2[0x25] = '\0';
      pbVar2[0x26] = '\0';
      pbVar2[0x27] = '\0';
      *(mallocator **)(pbVar2 + 0x28) = &Mallocator::Instance;
      pbVar2 = pbVar2 + 0x30;
    }
  }
  Array->Size = NewSize;
  return;
}

Assistant:

void
Resize(array<t>* Array, i64 NewSize)
{
  if (NewSize > Array->Capacity) // TODO: maybe grow the capacity until this is false
    GrowCapacity(Array, NewSize);
  if (Array->Size < NewSize)
    Fill(Begin(*Array) + Array->Size, Begin(*Array) + NewSize, t{});
  Array->Size = NewSize;
}